

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

iterator divsufsortxx::helper::
         pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first
                   ,iterator last)

{
  iterator v3;
  iterator v3_00;
  iterator v3_01;
  iterator v2;
  iterator v2_00;
  iterator v2_01;
  iterator v2_02;
  iterator v2_03;
  iterator v1;
  iterator v1_00;
  iterator v1_01;
  iterator v1_02;
  iterator v1_03;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_02;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_03;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_04;
  iterator v3_02;
  iterator v2_04;
  iterator v1_04;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_05;
  iterator v4;
  difference_type dVar1;
  iterator iVar2;
  iterator iVar3;
  pos_type in_stack_00000008;
  difference_type in_stack_00000010;
  iterator *in_stack_00000018;
  iterator middle;
  difference_type t;
  difference_type in_stack_fffffffffffffd70;
  difference_type i;
  iterator *in_stack_fffffffffffffd78;
  iterator *this;
  iterator *this_00;
  BitmapArray<long> *in_stack_fffffffffffffdd8;
  BitmapArray<long> *pBVar4;
  pos_type in_stack_fffffffffffffde0;
  BitmapArray<long> *pBVar5;
  BitmapArray<long> *in_stack_fffffffffffffde8;
  BitmapArray<long> *pBVar6;
  pos_type in_stack_fffffffffffffdf0;
  BitmapArray<long> *pBVar7;
  BitmapArray<long> *in_stack_fffffffffffffdf8;
  BitmapArray<long> *pBVar8;
  pos_type in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  BitmapArray<long> *in_stack_fffffffffffffe58;
  pos_type in_stack_fffffffffffffe60;
  BitmapArray<long> *in_stack_fffffffffffffe68;
  pos_type in_stack_fffffffffffffe70;
  BitmapArray<long> *in_stack_fffffffffffffe78;
  pos_type in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  pos_type in_stack_fffffffffffffeb0;
  BitmapArray<long> *in_stack_fffffffffffffeb8;
  pos_type in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  iterator local_38;
  iterator local_28;
  iterator local_18;
  
  dVar1 = bitmap::BitmapArray<long>::iterator::operator-(&local_38,&local_28);
  bitmap::BitmapArray<long>::iterator::operator+
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  if (dVar1 < 0x201) {
    if (dVar1 < 0x21) {
      bitmap::BitmapArray<long>::iterator::operator-
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      Td_00.m_PA = in_stack_fffffffffffffe28;
      Td_00.m_Td = in_stack_fffffffffffffe20;
      v1.pos_ = in_stack_fffffffffffffe00;
      v1.array_ = in_stack_fffffffffffffdf8;
      v2.pos_ = in_stack_fffffffffffffdf0;
      v2.array_ = in_stack_fffffffffffffde8;
      v3.pos_ = in_stack_fffffffffffffde0;
      v3.array_ = in_stack_fffffffffffffdd8;
      local_18 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                           (Td_00,v1,v2,v3);
    }
    else {
      bitmap::BitmapArray<long>::iterator::operator+
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      bitmap::BitmapArray<long>::iterator::operator-
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      bitmap::BitmapArray<long>::iterator::operator-
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      bitmap::BitmapArray<long>::iterator::operator-
                (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      Td_05.m_PA.array_ = (BitmapArray<long> *)in_stack_fffffffffffffea8;
      Td_05.m_Td = (char *)in_stack_fffffffffffffea0;
      Td_05.m_PA.pos_ = in_stack_fffffffffffffeb0;
      v1_04.pos_ = in_stack_fffffffffffffe80;
      v1_04.array_ = in_stack_fffffffffffffe78;
      v2_04.pos_ = in_stack_fffffffffffffe70;
      v2_04.array_ = in_stack_fffffffffffffe68;
      v3_02.pos_ = in_stack_fffffffffffffe60;
      v3_02.array_ = in_stack_fffffffffffffe58;
      v4.pos_ = in_stack_fffffffffffffec0;
      v4.array_ = in_stack_fffffffffffffeb8;
      local_18 = median5<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                           (Td_05,v1_04,v2_04,v3_02,v4,in_stack_fffffffffffffec8);
    }
  }
  else {
    i = in_stack_00000010;
    this = in_stack_00000018;
    bitmap::BitmapArray<long>::iterator::operator+
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    bitmap::BitmapArray<long>::iterator::operator+
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    Td_01.m_PA = in_stack_fffffffffffffe28;
    Td_01.m_Td = in_stack_fffffffffffffe20;
    v1_00.pos_ = in_stack_fffffffffffffe00;
    v1_00.array_ = in_stack_fffffffffffffdf8;
    v2_00.pos_ = in_stack_fffffffffffffdf0;
    v2_00.array_ = in_stack_fffffffffffffde8;
    iVar2.pos_ = in_stack_fffffffffffffde0;
    iVar2.array_ = in_stack_fffffffffffffdd8;
    median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
              (Td_01,v1_00,v2_00,iVar2);
    bitmap::BitmapArray<long>::iterator::operator-(this,i);
    this_00 = in_stack_00000018;
    iVar2 = bitmap::BitmapArray<long>::iterator::operator+(this,i);
    Td_02.m_PA = iVar2;
    Td_02.m_Td = in_stack_fffffffffffffe20;
    v1_01.pos_ = in_stack_fffffffffffffe00;
    v1_01.array_ = in_stack_fffffffffffffdf8;
    v2_01.pos_ = in_stack_fffffffffffffdf0;
    v2_01.array_ = in_stack_fffffffffffffde8;
    iVar3.pos_ = in_stack_fffffffffffffde0;
    iVar3.array_ = in_stack_fffffffffffffdd8;
    median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
              (Td_02,v1_01,v2_01,iVar3);
    iVar3 = bitmap::BitmapArray<long>::iterator::operator-(this_00,in_stack_00000010);
    pBVar5 = iVar3.array_;
    pBVar6 = (BitmapArray<long> *)iVar3.pos_;
    iVar3 = bitmap::BitmapArray<long>::iterator::operator-(this_00,in_stack_00000010);
    pBVar7 = iVar3.array_;
    pBVar8 = (BitmapArray<long> *)iVar3.pos_;
    bitmap::BitmapArray<long>::iterator::operator-(this_00,in_stack_00000010);
    iVar3 = bitmap::BitmapArray<long>::iterator::operator-(this_00,in_stack_00000010);
    pBVar4 = (BitmapArray<long> *)iVar3.pos_;
    bitmap::BitmapArray<long>::iterator::operator-(this_00,in_stack_00000010);
    Td_03.m_PA = iVar2;
    Td_03.m_Td = in_stack_fffffffffffffe20;
    v1_02.pos_ = in_stack_00000008;
    v1_02.array_ = pBVar8;
    v2_02.pos_ = (pos_type)pBVar7;
    v2_02.array_ = pBVar6;
    v3_00.pos_ = (pos_type)pBVar5;
    v3_00.array_ = pBVar4;
    iVar3 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td_03,v1_02,v2_02,v3_00);
    Td_04.m_PA = iVar2;
    Td_04.m_Td = (char *)iVar3.pos_;
    v1_03.pos_ = in_stack_00000008;
    v1_03.array_ = pBVar8;
    v2_03.pos_ = (pos_type)pBVar7;
    v2_03.array_ = pBVar6;
    v3_01.pos_ = (pos_type)pBVar5;
    v3_01.array_ = pBVar4;
    local_18 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                         (Td_04,v1_03,v2_03,v3_01);
  }
  return local_18;
}

Assistant:

SAIterator_type pivot(const StringIterator_type Td, SAIterator_type first,
                      SAIterator_type last) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  difference_type t = last - first;
  SAIterator_type middle = first + t / 2;

  if (t <= 512) {
    if (t <= 32) {
      return median3(Td, first, middle, last - 1);
    } else {
      t >>= 2;
      return median5(Td, first, first + t, middle, last - 1 - t, last - 1);
    }
  }
  t >>= 3;
  return median3(Td, median3(Td, first, first + t, first + (t << 1)),
                 median3(Td, middle - t, middle, middle + t),
                 median3(Td, last - 1 - (t << 1), last - 1 - t, last - 1));
}